

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * __thiscall
pbrt::ProjectionLight::Bounds(LightBounds *__return_storage_ptr__,ProjectionLight *this)

{
  Transform *this_00;
  Image *this_01;
  Point2i p;
  LightBounds *pLVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  long lVar3;
  int u;
  long lVar4;
  long lVar5;
  Float FVar6;
  float fVar7;
  float theta_e;
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Point3<float> PVar12;
  Vector3<float> VVar13;
  initializer_list<float> __l;
  float local_9c;
  Tuple3<pbrt::Point3,_float> local_98;
  LightBounds *local_88;
  long local_80;
  WrapMode2D local_78;
  WrapMode2D local_70;
  WrapMode2D local_68;
  Tuple3<pbrt::Point3,_float> local_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  
  TVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  this_01 = &this->image;
  lVar5 = 0;
  local_9c = 0.0;
  lVar3 = 0;
  local_88 = __return_storage_ptr__;
  while (lVar3 < (long)TVar2 >> 0x20) {
    local_80 = lVar3;
    for (lVar4 = 0; lVar4 < TVar2.x; lVar4 = lVar4 + 1) {
      WrapMode2D::WrapMode2D(&local_68,Clamp);
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar5 + lVar4);
      FVar6 = Image::GetChannel(this_01,p,0,local_68);
      local_98.x = FVar6;
      WrapMode2D::WrapMode2D(&local_70,Clamp);
      FVar6 = Image::GetChannel(this_01,p,1,local_70);
      local_98.y = FVar6;
      WrapMode2D::WrapMode2D(&local_78,Clamp);
      local_98.z = Image::GetChannel(this_01,p,2,local_78);
      __l._M_len = 3;
      __l._M_array = &local_98.x;
      fVar7 = std::max<float>(__l);
      TVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      local_9c = local_9c + fVar7;
    }
    lVar5 = lVar5 + 0x100000000;
    lVar3 = local_80 + 1;
  }
  this_00 = &(this->super_LightBase).renderFromLight;
  fVar7 = this->scale;
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_60.z = 0.0;
  auVar11 = ZEXT856(0);
  PVar12 = Transform::operator()(this_00,(Point3<float> *)&local_60);
  local_98.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar11;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_98._0_8_ = vmovlps_avx(auVar8._0_16_);
  local_50.z = 1.0;
  VVar13 = Transform::operator()(this_00,(Vector3<float> *)&local_50);
  local_40.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  local_40._0_8_ = vmovlps_avx(auVar9._0_16_);
  VVar13 = Normalize<float>((Vector3<float> *)&local_40);
  local_60.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  local_60._0_8_ = vmovlps_avx(auVar10._0_16_);
  theta_e = acosf(this->cosTotalWidth);
  pLVar1 = local_88;
  LightBounds::LightBounds
            (local_88,(Point3f *)&local_98,(Vector3f *)&local_60,
             (local_9c * fVar7) / (float)(TVar2.x * TVar2.y),0.0,theta_e,false);
  return pLVar1;
}

Assistant:

LightBounds ProjectionLight::Bounds() const {
#if 0
    // Along the lines of Phi()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u) {
            Point2f ps = screenBounds.Lerp({(u + .5f) / image.Resolution().x,
                                            (v + .5f) / image.Resolution().y});
            Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));
            w = Normalize(w);
            Float dwdA = Pow<3>(w.z);
            sum += image.GetChannels({u, v}, rgbChannelDesc).MaxValue() * dwdA;
        }
    Float phi = scale * A * sum / (image.Resolution().x * image.Resolution().y);
#else
    // See comment in SpotLight::Bounds()
    Float sum = 0;
    for (int v = 0; v < image.Resolution().y; ++v)
        for (int u = 0; u < image.Resolution().x; ++u)
            sum += std::max({image.GetChannel({u, v}, 0), image.GetChannel({u, v}, 1),
                             image.GetChannel({u, v}, 2)});
    Float phi = scale * sum / (image.Resolution().x * image.Resolution().y);
#endif
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    return LightBounds(p, w, phi, 0.f, std::acos(cosTotalWidth), false);
}